

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcPrsMem::reset(CTcPrsMem *this)

{
  CTcPrsMem *in_RDI;
  CTcPrsMem *unaff_retaddr;
  
  delete_all(in_RDI);
  alloc_block(unaff_retaddr);
  G_objfixup = (CTcIdFixup *)0x0;
  G_propfixup = (CTcIdFixup *)0x0;
  G_enumfixup = (CTcIdFixup *)0x0;
  return;
}

Assistant:

void CTcPrsMem::reset()
{
    /* delete all blocks */
    delete_all();

    /* re-allocate the initial block */
    alloc_block();

    /* fixups are allocated in parser memory, so they're gone now */
    G_objfixup = 0;
    G_propfixup = 0;
    G_enumfixup = 0;
}